

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_size_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_Int64MessageSize_Test::
GeneratedMessageTest_Int64MessageSize_Test(GeneratedMessageTest_Int64MessageSize_Test *this)

{
  GeneratedMessageTest_Int64MessageSize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageTest_Int64MessageSize_Test_02a021f0;
  return;
}

Assistant:

TEST(GeneratedMessageTest, Int64MessageSize) {
  struct MockGenerated : public MockMessageBase {  // 16 bytes
    int has_bits[1];                               // 4 bytes
    int cached_size;                               // 4 bytes
    PROTOBUF_TSAN_DECLARE_MEMBER;                  // 0-4 bytes
                                                   // + 0-4 bytes padding
    int64_t data;                                  // 8 bytes
  };
  ABSL_CHECK_MESSAGE_SIZE(MockGenerated, 32);
  EXPECT_EQ(sizeof(proto2_unittest::Int64Message), sizeof(MockGenerated));
}